

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O1

Name __thiscall
wasm::anon_unknown_13::getGlobalElem(anon_unknown_13 *this,Module *module,Name global,Index i)

{
  size_type *psVar1;
  ulong uVar2;
  IString *this_00;
  bool bVar3;
  char cVar4;
  char cVar5;
  long *plVar6;
  undefined8 *puVar7;
  uint __val;
  ulong *puVar8;
  uint uVar9;
  ulong uVar10;
  undefined4 in_register_00000084;
  Name root;
  string_view sVar11;
  IString IVar12;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  long *local_b0;
  ulong local_a8;
  long local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  size_type *local_70;
  string __str;
  long local_40;
  undefined8 uStack_38;
  
  __val = (uint)global.super_IString.str._M_str;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,global.super_IString.str._M_len,
             (long)&(module->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + global.super_IString.str._M_len,
             global.super_IString.str._M_str,CONCAT44(in_register_00000084,i));
  plVar6 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_b0,local_a8,0,'\x01');
  puVar8 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar8) {
    local_80 = *puVar8;
    lStack_78 = plVar6[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar8;
    local_90 = (ulong *)*plVar6;
  }
  local_88 = plVar6[1];
  *plVar6 = (long)puVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  cVar5 = '\x01';
  if (9 < __val) {
    uVar9 = __val;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar9 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_0081fc84;
      }
      if (uVar9 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_0081fc84;
      }
      if (uVar9 < 10000) goto LAB_0081fc84;
      bVar3 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar3);
    cVar5 = cVar5 + '\x01';
  }
LAB_0081fc84:
  psVar1 = &__str._M_string_length;
  local_70 = psVar1;
  std::__cxx11::string::_M_construct((ulong)&local_70,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_70,(uint)__str._M_dataplus._M_p,__val);
  uVar2 = CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p) + local_88;
  uVar10 = 0xf;
  if (local_90 != &local_80) {
    uVar10 = local_80;
  }
  if (uVar10 < uVar2) {
    uVar10 = 0xf;
    if (local_70 != psVar1) {
      uVar10 = __str._M_string_length;
    }
    if (uVar2 <= uVar10) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
      goto LAB_0081fd01;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70);
LAB_0081fd01:
  __str.field_2._8_8_ = &local_40;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_40 = *plVar6;
    uStack_38 = puVar7[3];
  }
  else {
    local_40 = *plVar6;
    __str.field_2._8_8_ = (long *)*puVar7;
  }
  this_00 = (IString *)puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  sVar11._M_str = (char *)0x0;
  sVar11._M_len = __str.field_2._8_8_;
  sVar11 = IString::interned(this_00,sVar11,SUB81(plVar6,0));
  local_d8._8_8_ = 0;
  pcStack_c0 = std::
               _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:68:23)>
               ::_M_invoke;
  local_c8 = std::
             _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:68:23)>
             ::_M_manager;
  root.super_IString.str._M_str = (char *)&local_d8;
  root.super_IString.str._M_len = (size_t)sVar11._M_str;
  local_d8._M_unused._0_8_ = (undefined8)this;
  IVar12.str = (string_view)
               Names::getValidName((Names *)sVar11._M_len,root,
                                   (function<bool_(wasm::Name)> *)&local_d8);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if ((long *)__str.field_2._8_8_ != &local_40) {
    operator_delete((void *)__str.field_2._8_8_,local_40 + 1);
  }
  if (local_70 != psVar1) {
    operator_delete(local_70,__str._M_string_length + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  return (IString)(IString)IVar12.str;
}

Assistant:

Name getGlobalElem(Module* module, Name global, Index i) {
  return Names::getValidGlobalName(*module,
                                   global.toString() + '$' + std::to_string(i));
}